

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz77.cpp
# Opt level: O0

options * parse(options *opt,int *ptr,char **argv,int argc)

{
  char *pcVar1;
  undefined8 uVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  undefined1 *puVar6;
  void *this;
  long in_RCX;
  int *in_RDX;
  undefined8 *in_RSI;
  options *in_RDI;
  int in_R8D;
  string sep;
  int block_size;
  string s;
  int *in_stack_fffffffffffffd58;
  basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>
  *in_stack_fffffffffffffd60;
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [32];
  istringstream local_1d8 [384];
  int local_58;
  allocator local_41;
  string local_40 [36];
  int local_1c;
  long local_18;
  int *local_10;
  undefined8 *local_8;
  
  pcVar1 = *(char **)(in_RCX + (long)*in_RDX * 8);
  local_1c = in_R8D;
  local_18 = in_RCX;
  local_10 = in_RDX;
  local_8 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,pcVar1,&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  *local_10 = *local_10 + 1;
  iVar3 = std::__cxx11::string::compare((char *)local_40);
  if (iVar3 == 0) {
    *(undefined4 *)(local_8 + 1) = 0;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)local_40);
    if (iVar3 == 0) {
      *(undefined4 *)(local_8 + 1) = 1;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)local_40);
      if (iVar3 == 0) {
        if (local_1c <= *local_10) {
          poVar4 = std::operator<<((ostream *)&std::cout,"Missing block size in option --p");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          help();
        }
        pcVar1 = *(char **)(local_18 + (long)*local_10 * 8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1f8,pcVar1,&local_1f9);
        std::__cxx11::istringstream::istringstream(local_1d8,local_1f8,_S_in);
        std::operator>>(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
        std::__cxx11::istringstream::~istringstream(local_1d8);
        std::__cxx11::string::~string(local_1f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
        if (local_58 < 1) {
          poVar4 = std::operator<<((ostream *)&std::cout,"error: block size in --p must be > 0");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          help();
        }
        local_8[2] = (long)local_58;
        *local_10 = *local_10 + 1;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)local_40);
        if (iVar3 == 0) {
          *(undefined1 *)((long)local_8 + 4) = 1;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)local_40);
          if (iVar3 == 0) {
            if (local_1c <= *local_10) {
              poVar4 = std::operator<<((ostream *)&std::cout,
                                       "Missing separator character in option --s");
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              help();
            }
            pcVar1 = *(char **)(local_18 + (long)*local_10 * 8);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_220,pcVar1,&local_221);
            std::allocator<char>::~allocator((allocator<char> *)&local_221);
            lVar5 = std::__cxx11::string::length();
            if (lVar5 != 1) {
              poVar4 = std::operator<<((ostream *)&std::cout,
                                       "Error: separator must be a single character.");
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              help();
            }
            puVar6 = (undefined1 *)std::__cxx11::string::at((ulong)local_220);
            *(undefined1 *)(local_8 + 3) = *puVar6;
            *local_10 = *local_10 + 1;
            std::__cxx11::string::~string(local_220);
          }
          else {
            poVar4 = std::operator<<((ostream *)&std::cout,"Unrecognized option ");
            poVar4 = std::operator<<(poVar4,local_40);
            this = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
            help();
          }
        }
      }
    }
  }
  uVar2 = *local_8;
  in_RDI->mode = (int)uVar2;
  in_RDI->verbose = (bool)(char)((ulong)uVar2 >> 0x20);
  *(int3 *)&in_RDI->field_0x5 = (int3)((ulong)uVar2 >> 0x28);
  *(undefined8 *)&in_RDI->lz_variant = local_8[1];
  in_RDI->block = local_8[2];
  uVar2 = local_8[3];
  in_RDI->sep = (char)uVar2;
  in_RDI->prepend_alphabet = (bool)(char)((ulong)uVar2 >> 8);
  *(int6 *)&in_RDI->field_0x1a = (int6)((ulong)uVar2 >> 0x10);
  std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

lz77_t::options parse(lz77_t::options &opt, int &ptr, char** argv, int argc){

	string s(argv[ptr]);
	ptr++;

	if(s.compare("--v1")==0){

		opt.lz_variant = lz77_t::v1;

	}else if(s.compare("--v2")==0){

		opt.lz_variant = lz77_t::v2;

	}else if(s.compare("--p")==0){

		if(ptr>=argc){
			cout<<"Missing block size in option --p" << endl;
			help();
		}

		int block_size;
		istringstream ( string(argv[ptr]) ) >> block_size;

		if(block_size<=0){
			cout << "error: block size in --p must be > 0" << endl;
			help();
		}

		opt.block=block_size;

		ptr++;

	}else if(s.compare("--verbose")==0){

		opt.verbose = true;

	}else if(s.compare("--s")==0){

		if(ptr>=argc){
			cout<<"Missing separator character in option --s" << endl;
			help();
		}

		string sep(argv[ptr]);

		if(sep.length()!=1){
			cout << "Error: separator must be a single character." << endl;
			help();
		}

		opt.sep = sep.at(0);
		ptr++;

	}else{

		cout << "Unrecognized option " << s<< endl << endl;
		help();
	}

	return opt;
}